

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klibexec.h
# Opt level: O2

void KDict_MergeData(KonohaContext *kctx,KDict *dict,KKeyValue *kvs,size_t nitems,int isOverride)

{
  ksymbol_t kVar1;
  _func_KKeyValue_ptr_KonohaContext_ptr_KDict_ptr_ksymbol_t *p_Var2;
  _func_void_KonohaContext_ptr_KDict_ptr_KKeyValue_ptr *p_Var3;
  long lVar4;
  anon_union_8_4_5585e3e3_for_KKeyValue_2 aVar5;
  ktypeattr_t kVar6;
  KDict *pKVar7;
  KKeyValue *pKVar8;
  size_t sVar9;
  KKeyValue *pKVar10;
  undefined8 uStack_50;
  void *local_48;
  KDict *local_40;
  int local_34;
  
  local_34 = isOverride;
  if ((dict->data).bytesize < 0x10) {
    uStack_50 = 0x104d53;
    KDict_Ensure(kctx,dict,nitems);
    uStack_50 = 0x104d66;
    memcpy((dict->data).field_1.bytebuf,kvs,nitems << 4);
    (dict->data).bytesize = nitems << 4;
    KDict_Sort(kctx,dict);
    return;
  }
  lVar4 = -(nitems + 0xf & 0xfffffffffffffff0);
  local_48 = (void *)((long)&local_48 + lVar4);
  local_40 = dict;
  *(undefined8 *)((long)&uStack_50 + lVar4) = 0x104da7;
  memset((void *)((long)&local_48 + lVar4),0,nitems);
  pKVar10 = kvs;
  for (sVar9 = 0; pKVar7 = local_40, nitems != sVar9; sVar9 = sVar9 + 1) {
    kVar1 = pKVar10->key;
    p_Var2 = kctx->klib->KDict_GetNULL;
    *(undefined8 *)((long)&uStack_50 + lVar4) = 0x104dc1;
    pKVar8 = (*p_Var2)(kctx,pKVar7,kVar1);
    if ((pKVar8 != (KKeyValue *)0x0) && (*(undefined1 *)((long)local_48 + sVar9) = 1, local_34 != 0)
       ) {
      kVar6 = pKVar10->typeAttr;
      aVar5 = pKVar10->field_2;
      pKVar8->key = pKVar10->key;
      pKVar8->typeAttr = kVar6;
      pKVar8->field_2 = aVar5;
    }
    pKVar10 = pKVar10 + 1;
  }
  for (sVar9 = 0; nitems != sVar9; sVar9 = sVar9 + 1) {
    if (*(char *)((long)local_48 + sVar9) == '\0') {
      p_Var3 = kctx->klib->KDict_Add;
      *(undefined8 *)((long)&uStack_50 + lVar4) = 0x104e0d;
      (*p_Var3)(kctx,pKVar7,kvs);
    }
    kvs = kvs + 1;
  }
  return;
}

Assistant:

KLIBDECL void KDict_MergeData(KonohaContext *kctx, KDict *dict, KKeyValue *kvs, size_t nitems, int isOverride)
{
	size_t i;
	kbool_t *foundItems;
	if(KDict_size(dict) == 0) {
		KDict_Ensure(kctx, dict, nitems);
		memcpy(dict->data.keyValueItems, kvs, nitems * sizeof(KKeyValue));
		dict->data.bytesize = nitems * sizeof(KKeyValue);
		KDict_Sort(kctx, dict);
		return;
	}
	foundItems = ALLOCA(kbool_t, nitems);
	bzero(foundItems, sizeof(kbool_t) * nitems);
	for(i = 0; i < nitems; i++) {
		KKeyValue *stored = KLIB KDict_GetNULL(kctx, dict, kvs[i].key);
		if(stored != NULL) {
			foundItems[i] = true;
			if(isOverride) {
				stored[0] = kvs[i];
			}
		}
	}
	for(i = 0; i < nitems; i++) {
		if(!foundItems[i]) {
			KLIB KDict_Add(kctx, dict, kvs + i);
		}
	}
}